

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Trigger * sqlite3TriggersExist(Parse *pParse,Table *pTab,int op,ExprList *pChanges,int *pMask)

{
  int iVar1;
  Trigger *local_50;
  Trigger *local_48;
  Trigger *p;
  Trigger *pList;
  int mask;
  int *pMask_local;
  ExprList *pChanges_local;
  int op_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  pList._4_4_ = 0;
  p = (Trigger *)0x0;
  if ((pParse->db->flags & 0x40000) != 0) {
    p = sqlite3TriggerList(pParse,pTab);
  }
  for (local_48 = p; local_48 != (Trigger *)0x0; local_48 = local_48->pNext) {
    if ((uint)local_48->op == op) {
      iVar1 = checkColumnOverlap(local_48->pColumns,pChanges);
      if (iVar1 != 0) {
        pList._4_4_ = local_48->tr_tm | pList._4_4_;
      }
    }
  }
  if (pMask != (int *)0x0) {
    *pMask = pList._4_4_;
  }
  if (pList._4_4_ == 0) {
    local_50 = (Trigger *)0x0;
  }
  else {
    local_50 = p;
  }
  return local_50;
}

Assistant:

SQLITE_PRIVATE Trigger *sqlite3TriggersExist(
  Parse *pParse,          /* Parse context */
  Table *pTab,            /* The table the contains the triggers */
  int op,                 /* one of TK_DELETE, TK_INSERT, TK_UPDATE */
  ExprList *pChanges,     /* Columns that change in an UPDATE statement */
  int *pMask              /* OUT: Mask of TRIGGER_BEFORE|TRIGGER_AFTER */
){
  int mask = 0;
  Trigger *pList = 0;
  Trigger *p;

  if( (pParse->db->flags & SQLITE_EnableTrigger)!=0 ){
    pList = sqlite3TriggerList(pParse, pTab);
  }
  assert( pList==0 || IsVirtual(pTab)==0 );
  for(p=pList; p; p=p->pNext){
    if( p->op==op && checkColumnOverlap(p->pColumns, pChanges) ){
      mask |= p->tr_tm;
    }
  }
  if( pMask ){
    *pMask = mask;
  }
  return (mask ? pList : 0);
}